

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaError Pa_Terminate(void)

{
  if (initializationCount_ == 0) {
    return -10000;
  }
  if (initializationCount_ == 1) {
    while (firstOpenStream_ != (PaUtilStreamRepresentation *)0x0) {
      Pa_CloseStream(firstOpenStream_);
    }
    TerminateHostApis();
    PaUtil_TerminateHotPlug();
  }
  initializationCount_ = initializationCount_ + -1;
  return 0;
}

Assistant:

PaError Pa_Terminate( void )
{
    PaError result;

    PA_LOGAPI_ENTER( "Pa_Terminate" );

    if( PA_IS_INITIALISED_ )
    {
        // leave initializationCount_>0 so that Pa_CloseStream() can execute
        if( initializationCount_ == 1 )
        {
            CloseOpenStreams();

            TerminateHostApis();

            PaUtil_TerminateHotPlug();

            PaUtil_DumpTraceMessages();
        }
        --initializationCount_;
        result = paNoError;
    }
    else
    {
        result=  paNotInitialized;
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_Terminate", result );

    return result;
}